

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

void __thiscall Matrix4f::setSubmatrix3x3(Matrix4f *this,int i0,int j0,Matrix3f *m)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  int j;
  long lVar5;
  
  lVar4 = 0;
  pfVar2 = this->m_elements + (long)i0 + (long)j0 * 4;
  do {
    lVar5 = 0;
    pfVar3 = pfVar2;
    do {
      pfVar1 = Matrix3f::operator()(m,(int)lVar4,(int)lVar5);
      lVar5 = lVar5 + 1;
      *pfVar3 = *pfVar1;
      pfVar3 = pfVar3 + 4;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

void Matrix4f::setSubmatrix3x3( int i0, int j0, const Matrix3f& m )
{
	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			( *this )( i + i0, j + j0 ) = m( i, j );
		}
	}
}